

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

cmSourceFileLocation * __thiscall
cmSourceFileLocation::operator=(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  cmSourceFileLocation *loc_local;
  cmSourceFileLocation *this_local;
  
  if (this != loc) {
    this->Makefile = loc->Makefile;
    this->AmbiguousDirectory = (bool)(loc->AmbiguousDirectory & 1);
    this->AmbiguousExtension = (bool)(loc->AmbiguousExtension & 1);
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)&loc->Directory);
    std::__cxx11::string::operator=((string *)&this->Name,(string *)&loc->Name);
    UpdateExtension(this,&this->Name);
  }
  return this;
}

Assistant:

cmSourceFileLocation& cmSourceFileLocation::operator=(
  const cmSourceFileLocation& loc)
{
  if (this == &loc) {
    return *this;
  }
  this->Makefile = loc.Makefile;
  this->AmbiguousDirectory = loc.AmbiguousDirectory;
  this->AmbiguousExtension = loc.AmbiguousExtension;
  this->Directory = loc.Directory;
  this->Name = loc.Name;
  this->UpdateExtension(this->Name);
  return *this;
}